

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_mllr.c
# Opt level: O1

ps_mllr_t * ps_mllr_read(char *regmatfile)

{
  int iVar1;
  ps_mllr_t *mllr;
  FILE *__stream;
  int *piVar2;
  float32 ****ppppfVar3;
  float32 ***pppfVar4;
  float32 **ppfVar5;
  char *pcVar6;
  long lVar7;
  undefined4 uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  int n;
  int local_3c;
  long local_38;
  
  mllr = (ps_mllr_t *)
         __ckd_calloc__(1,0x38,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
                        ,0x36);
  mllr->refcnt = 1;
  __stream = fopen(regmatfile,"r");
  if (__stream == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
                   ,0x3a,"Failed to open MLLR file \'%s\' for reading",regmatfile);
  }
  else {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
            ,0x3e,"Reading MLLR transformation file \'%s\'\n",regmatfile);
    iVar1 = __isoc99_fscanf(__stream,"%d",&local_3c);
    if (local_3c < 1 || iVar1 != 1) {
      pcVar6 = "Failed to read number of MLLR classes\n";
      lVar7 = 0x41;
    }
    else {
      mllr->n_class = local_3c;
      iVar1 = __isoc99_fscanf(__stream,"%d",&local_3c);
      if (iVar1 == 1) {
        mllr->n_feat = local_3c;
        piVar2 = (int *)__ckd_calloc__((long)local_3c,4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
                                       ,0x4b);
        mllr->veclen = piVar2;
        ppppfVar3 = (float32 ****)
                    __ckd_calloc__((long)mllr->n_feat,8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
                                   ,0x4d);
        mllr->A = ppppfVar3;
        pppfVar4 = (float32 ***)
                   __ckd_calloc__((long)mllr->n_feat,8,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
                                  ,0x4e);
        mllr->b = pppfVar4;
        pppfVar4 = (float32 ***)
                   __ckd_calloc__((long)mllr->n_feat,8,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
                                  ,0x4f);
        mllr->h = pppfVar4;
        if (0 < mllr->n_feat) {
          uVar11 = 0;
          do {
            iVar1 = __isoc99_fscanf(__stream,"%d",&local_3c);
            if (iVar1 != 1) {
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
                      ,0x53,"Failed to read stream length for feature %d\n",uVar11 & 0xffffffff);
              goto LAB_0011415e;
            }
            mllr->veclen[uVar11] = local_3c;
            pppfVar4 = (float32 ***)
                       __ckd_calloc_3d__((long)mllr->n_class,(long)local_3c,(long)local_3c,4,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
                                         ,0x59);
            mllr->A[uVar11] = pppfVar4;
            ppfVar5 = (float32 **)
                      __ckd_calloc_2d__((long)mllr->n_class,(long)mllr->veclen[uVar11],4,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
                                        ,0x5c);
            mllr->b[uVar11] = ppfVar5;
            ppfVar5 = (float32 **)
                      __ckd_calloc_2d__((long)mllr->n_class,(long)mllr->veclen[uVar11],4,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
                                        ,0x5f);
            mllr->h[uVar11] = ppfVar5;
            if (0 < mllr->n_class) {
              local_38 = 0;
              do {
                if (0 < mllr->veclen[uVar11]) {
                  lVar7 = 0;
                  do {
                    if (0 < mllr->veclen[uVar11]) {
                      lVar10 = 0;
                      lVar9 = 0;
                      do {
                        iVar1 = __isoc99_fscanf(__stream,"%f ",
                                                (long)mllr->A[uVar11][local_38][lVar7] + lVar10);
                        if (iVar1 != 1) {
                          uVar8 = (undefined4)lVar7;
                          pcVar6 = "Failed reading MLLR rotation (%d,%d,%d,%d)\n";
                          lVar7 = 0x66;
                          goto LAB_001141a2;
                        }
                        lVar9 = lVar9 + 1;
                        lVar10 = lVar10 + 4;
                      } while (lVar9 < mllr->veclen[uVar11]);
                    }
                    lVar7 = lVar7 + 1;
                  } while (lVar7 < mllr->veclen[uVar11]);
                }
                if (0 < mllr->veclen[uVar11]) {
                  lVar9 = 0;
                  lVar7 = 0;
                  do {
                    iVar1 = __isoc99_fscanf(__stream,"%f ",(long)mllr->b[uVar11][local_38] + lVar9);
                    if (iVar1 != 1) {
                      uVar8 = (undefined4)lVar7;
                      pcVar6 = "Failed reading MLLR bias (%d,%d,%d)\n";
                      lVar7 = 0x6e;
                      goto LAB_001141a2;
                    }
                    lVar7 = lVar7 + 1;
                    lVar9 = lVar9 + 4;
                  } while (lVar7 < mllr->veclen[uVar11]);
                }
                if (0 < mllr->veclen[uVar11]) {
                  lVar9 = 0;
                  lVar7 = 0;
                  do {
                    iVar1 = __isoc99_fscanf(__stream,"%f ",(long)mllr->h[uVar11][local_38] + lVar9);
                    if (iVar1 != 1) {
                      uVar8 = (undefined4)lVar7;
                      pcVar6 = "Failed reading MLLR variance scale (%d,%d,%d)\n";
                      lVar7 = 0x75;
LAB_001141a2:
                      err_msg(ERR_ERROR,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
                              ,lVar7,pcVar6,uVar11 & 0xffffffff,local_38,uVar8);
                      goto LAB_0011415e;
                    }
                    lVar7 = lVar7 + 1;
                    lVar9 = lVar9 + 4;
                  } while (lVar7 < mllr->veclen[uVar11]);
                }
                local_38 = local_38 + 1;
              } while (local_38 < mllr->n_class);
            }
            uVar11 = uVar11 + 1;
          } while ((long)uVar11 < (long)mllr->n_feat);
        }
        fclose(__stream);
        return mllr;
      }
      pcVar6 = "Failed to read number of feature streams\n";
      lVar7 = 0x47;
    }
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
            ,lVar7,pcVar6);
  }
LAB_0011415e:
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  ps_mllr_free(mllr);
  return (ps_mllr_t *)0x0;
}

Assistant:

ps_mllr_t *
ps_mllr_read(char const *regmatfile)
{
    ps_mllr_t *mllr;
    FILE *fp;
    int n, i, m, j, k;

    mllr = ckd_calloc(1, sizeof(*mllr));
    mllr->refcnt = 1;

    if ((fp = fopen(regmatfile, "r")) == NULL) {
        E_ERROR_SYSTEM("Failed to open MLLR file '%s' for reading", regmatfile);
        goto error_out;
    }
    else
        E_INFO("Reading MLLR transformation file '%s'\n", regmatfile);

    if ((fscanf(fp, "%d", &n) != 1) || (n < 1)) {
        E_ERROR("Failed to read number of MLLR classes\n");
        goto error_out;
    }
    mllr->n_class = n;

    if ((fscanf(fp, "%d", &n) != 1)) {
        E_ERROR("Failed to read number of feature streams\n");
        goto error_out;
    }
    mllr->n_feat = n;
    mllr->veclen = ckd_calloc(mllr->n_feat, sizeof(*mllr->veclen));

    mllr->A = (float32 ****) ckd_calloc(mllr->n_feat, sizeof(float32 **));
    mllr->b = (float32 ***) ckd_calloc(mllr->n_feat, sizeof(float32 *));
    mllr->h = (float32 ***) ckd_calloc(mllr->n_feat, sizeof(float32 *));

    for (i = 0; i < mllr->n_feat; ++i) {
        if (fscanf(fp, "%d", &n) != 1) {
            E_ERROR("Failed to read stream length for feature %d\n", i);
            goto error_out;
        }
        mllr->veclen[i] = n;
        mllr->A[i] =
            (float32 ***) ckd_calloc_3d(mllr->n_class, mllr->veclen[i],
                                        mllr->veclen[i], sizeof(float32));
        mllr->b[i] =
            (float32 **) ckd_calloc_2d(mllr->n_class, mllr->veclen[i],
                                       sizeof(float32));
        mllr->h[i] =
            (float32 **) ckd_calloc_2d(mllr->n_class, mllr->veclen[i],
                                       sizeof(float32));

        for (m = 0; m < mllr->n_class; ++m) {
            for (j = 0; j < mllr->veclen[i]; ++j) {
                for (k = 0; k < mllr->veclen[i]; ++k) {
                    if (fscanf(fp, "%f ", &mllr->A[i][m][j][k]) != 1) {
                        E_ERROR("Failed reading MLLR rotation (%d,%d,%d,%d)\n",
                                i, m, j, k);
                        goto error_out;
                    }
                }
            }
            for (j = 0; j < mllr->veclen[i]; ++j) {
                if (fscanf(fp, "%f ", &mllr->b[i][m][j]) != 1) {
                    E_ERROR("Failed reading MLLR bias (%d,%d,%d)\n",
                            i, m, j);
                    goto error_out;
                }
            }
            for (j = 0; j < mllr->veclen[i]; ++j) {
                if (fscanf(fp, "%f ", &mllr->h[i][m][j]) != 1) {
                    E_ERROR("Failed reading MLLR variance scale (%d,%d,%d)\n",
                            i, m, j);
                    goto error_out;
                }
            }
        }
    }
    fclose(fp);
    return mllr;

error_out:
    if (fp)
        fclose(fp);
    ps_mllr_free(mllr);
    return NULL;
}